

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeStepToLeaf(RtreeCursor *pCur)

{
  RtreeConstraint *pRVar1;
  int iVar2;
  uint uVar3;
  float fVar4;
  int iVar5;
  long lVar6;
  i64 iVar7;
  ulong uVar8;
  RtreeSearchPoint *pRVar9;
  byte bVar10;
  u8 uVar11;
  long lVar12;
  byte bVar13;
  double dVar14;
  RtreeDValue RVar15;
  double dVar16;
  double dVar17;
  RtreeCoord c;
  char local_131;
  int local_130;
  uint local_12c;
  int local_128;
  int local_124;
  long local_120;
  u8 *local_118;
  double local_110;
  RtreeSearchPoint *local_108;
  RtreeCursor *local_100;
  RtreeSearchPoint *local_f8;
  u8 *local_f0;
  RtreeNode *local_e8;
  u8 *local_e0;
  u8 *local_d8;
  u8 *local_d0;
  u8 *local_c8;
  u8 *local_c0;
  u8 *local_b8;
  u8 *local_b0;
  u8 *local_a8;
  u8 *local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  sqlite3_vtab *local_40;
  ulong local_38;
  
  local_40 = (pCur->base).pVtab;
  local_130 = 0;
  local_131 = local_40[1].field_0xe;
  pRVar9 = &pCur->sPoint;
  uVar8 = (ulong)(uint)pCur->nConstraint;
  if (pCur->nConstraint < 1) {
    uVar8 = 0;
  }
  lVar12 = uVar8 * 0x18 + 0x18;
  local_120 = lVar12;
  local_108 = pRVar9;
  local_100 = pCur;
  while ((pCur->bPoint != '\0' ||
         ((uVar11 = '\x01', pCur->nPoint != 0 &&
          (pRVar9 = pCur->aPoint, pRVar9 != (RtreeSearchPoint *)0x0))))) {
    if (pRVar9->iLevel == '\0') {
      uVar11 = '\0';
      break;
    }
    local_f8 = pRVar9;
    local_e8 = rtreeNodeOfFirstSearchPoint(pCur,&local_130);
    if (local_130 != 0) {
      return local_130;
    }
    local_12c = (uint)(ushort)(*(ushort *)(local_e8->zData + 2) << 8 |
                              *(ushort *)(local_e8->zData + 2) >> 8);
    bVar13 = local_f8->iCell;
    pRVar9 = local_f8;
    do {
      if (local_12c <= bVar13) {
        local_130 = 0;
        goto LAB_001b1f13;
      }
      local_a0 = local_e8->zData;
      lVar6 = (ulong)bVar13 * (ulong)(byte)local_40[1].field_0xf;
      local_118 = local_a0 + lVar6 + 4;
      local_f0 = local_a0 + lVar6 + 0xc;
      local_d8 = local_a0 + lVar6 + 0x30;
      local_e0 = local_a0 + lVar6 + 0x2c;
      local_c8 = local_a0 + lVar6 + 0x28;
      local_d0 = local_a0 + lVar6 + 0x24;
      local_b8 = local_a0 + lVar6 + 0x20;
      local_c0 = local_a0 + lVar6 + 0x1c;
      local_a8 = local_a0 + lVar6 + 0x18;
      local_b0 = local_a0 + lVar6 + 0x14;
      local_a0 = local_a0 + lVar6 + 0x10;
      iVar2 = 2;
      dVar17 = -1.0;
      lVar6 = 0;
      do {
        if (lVar12 == lVar6 + 0x18) goto LAB_001b1e73;
        pRVar1 = pCur->aConstraint;
        iVar5 = *(int *)((long)&pRVar1->op + lVar6);
        if (0x45 < iVar5) {
          lVar12 = *(long *)((long)&pRVar1->pInfo + lVar6);
          uVar3 = *(uint *)(lVar12 + 0x38);
          uVar8 = (ulong)uVar3;
          local_128 = iVar2;
          local_110 = dVar17;
          if ((iVar5 == 0x47) && (pRVar9->iLevel == '\x01')) {
            iVar7 = readInt64(local_118);
            *(i64 *)(lVar12 + 0x48) = iVar7;
          }
          iVar2 = uVar3 - 4;
          local_38 = uVar8;
          if (local_131 == '\x01') {
            switch(iVar2) {
            case 6:
              readCoord(local_d8,&c);
              local_50 = (double)c.i;
              readCoord(local_e0,&c);
              local_58 = (double)c.i;
            case 4:
              readCoord(local_c8,&c);
              local_60 = (double)c.i;
              readCoord(local_d0,&c);
              local_68 = (double)c.i;
            case 2:
              readCoord(local_b8,&c);
              local_70 = (double)c.i;
              readCoord(local_c0,&c);
              local_78 = (double)c.i;
            case 0:
              readCoord(local_a8,&c);
              local_80 = (double)c.i;
              readCoord(local_b0,&c);
              local_88 = (double)c.i;
            default:
              readCoord(local_a0,&c);
              local_90 = (double)c.i;
              readCoord(local_f0,&c);
              local_98 = (double)c.i;
            }
          }
          else {
            switch(iVar2) {
            case 6:
              readCoord(local_d8,&c);
              local_50 = (double)c.f;
              readCoord(local_e0,&c);
              local_58 = (double)c.f;
            case 4:
              readCoord(local_c8,&c);
              local_60 = (double)c.f;
              readCoord(local_d0,&c);
              local_68 = (double)c.f;
            case 2:
              readCoord(local_b8,&c);
              local_70 = (double)c.f;
              readCoord(local_c0,&c);
              local_78 = (double)c.f;
            case 0:
              readCoord(local_a8,&c);
              local_80 = (double)c.f;
              readCoord(local_b0,&c);
              local_88 = (double)c.f;
            default:
              readCoord(local_a0,&c);
              local_90 = (double)c.f;
              readCoord(local_f0,&c);
              local_98 = (double)c.f;
            }
          }
          if (iVar5 == 0x46) {
            local_124 = 0;
            iVar5 = (**(code **)((long)&pRVar1->u + lVar6))(lVar12,local_38,&local_98,&local_124);
            iVar2 = local_128;
            if (local_124 == 0) {
              iVar2 = 0;
            }
            dVar17 = 0.0;
          }
          else {
            *(double **)(lVar12 + 0x28) = &local_98;
            *(uint *)(lVar12 + 0x3c) = local_f8->iLevel - 1;
            RVar15 = local_f8->rScore;
            *(RtreeDValue *)(lVar12 + 0x50) = RVar15;
            *(RtreeDValue *)(lVar12 + 0x60) = RVar15;
            bVar13 = local_f8->eWithin;
            *(uint *)(lVar12 + 0x58) = (uint)bVar13;
            *(uint *)(lVar12 + 0x5c) = (uint)bVar13;
            iVar5 = (**(code **)((long)&pRVar1->u + lVar6))(lVar12);
            iVar2 = local_128;
            if (*(int *)(lVar12 + 0x5c) < local_128) {
              iVar2 = *(int *)(lVar12 + 0x5c);
            }
            dVar17 = *(double *)(lVar12 + 0x60);
            if ((0.0 <= local_110) && (local_110 <= dVar17)) {
              dVar17 = local_110;
            }
          }
          pCur = local_100;
          pRVar9 = local_f8;
          lVar12 = local_120;
          if (iVar5 != 0) {
            return iVar5;
          }
          goto LAB_001b1e4f;
        }
        uVar3 = *(int *)((long)&pRVar1->iCoord + lVar6) << 2;
        if (pRVar9->iLevel == '\x01') {
          uVar3 = *(uint *)(local_f0 + (int)uVar3);
          fVar4 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
          if (local_131 == '\x01') {
            dVar14 = (double)(int)fVar4;
          }
          else {
            dVar14 = (double)fVar4;
          }
          dVar16 = *(double *)((long)&pRVar1->u + lVar6);
          switch(iVar5) {
          case 0x42:
            goto switchD_001b1e00_caseD_42;
          case 0x43:
            if (dVar16 <= dVar14) goto LAB_001b1e71;
            break;
          case 0x44:
            if (dVar14 < dVar16) goto LAB_001b1e71;
            break;
          case 0x45:
            if (dVar14 <= dVar16) goto LAB_001b1e71;
            break;
          default:
            if ((dVar14 != dVar16) || (NAN(dVar14) || NAN(dVar16))) goto LAB_001b1e71;
          }
        }
        else {
          uVar8 = (ulong)(uVar3 & 0x3f8);
          if (iVar5 - 0x41U < 3) {
            uVar3 = *(uint *)(local_118 + uVar8 + 8);
            fVar4 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18);
            if (local_131 == '\x01') {
              dVar16 = (double)(int)fVar4;
            }
            else {
              dVar16 = (double)fVar4;
            }
            dVar14 = *(double *)((long)&pRVar1->u + lVar6);
            if (dVar16 <= dVar14) goto LAB_001b1e4f;
            if (iVar5 != 0x41) break;
          }
          else {
            dVar14 = *(double *)((long)&pRVar1->u + lVar6);
          }
          uVar3 = *(uint *)(local_118 + uVar8 + 0xc);
          fVar4 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
          if (local_131 == '\x01') {
            dVar16 = (double)(int)fVar4;
          }
          else {
            dVar16 = (double)fVar4;
          }
switchD_001b1e00_caseD_42:
          if (dVar16 < dVar14) break;
        }
LAB_001b1e4f:
        lVar6 = lVar6 + 0x18;
      } while (iVar2 != 0);
LAB_001b1e71:
      iVar2 = 0;
LAB_001b1e73:
      bVar10 = pRVar9->iCell;
      bVar13 = bVar10 + 1;
      pRVar9->iCell = bVar13;
    } while (iVar2 == 0);
    local_130 = 0;
    uVar11 = pRVar9->iLevel + 0xff;
    local_110 = dVar17;
    if (uVar11 == '\0') {
      iVar7 = pRVar9->id;
    }
    else {
      iVar7 = readInt64(local_118);
      bVar10 = 0;
    }
    if (local_12c <= bVar13) {
      rtreeSearchPointPop(pCur);
    }
    RVar15 = 0.0;
    if (0.0 <= local_110) {
      RVar15 = local_110;
    }
    pRVar9 = rtreeSearchPointNew(pCur,RVar15,uVar11);
    if (pRVar9 == (RtreeSearchPoint *)0x0) {
      return 7;
    }
    pRVar9->eWithin = (u8)iVar2;
    pRVar9->id = iVar7;
    pRVar9->iCell = bVar10;
    lVar12 = local_120;
    bVar13 = bVar10;
LAB_001b1f13:
    pRVar9 = local_108;
    if (local_12c <= bVar13) {
      rtreeSearchPointPop(pCur);
    }
  }
  pCur->atEOF = uVar11;
  return 0;
}

Assistant:

static int rtreeStepToLeaf(RtreeCursor *pCur){
  RtreeSearchPoint *p;
  Rtree *pRtree = RTREE_OF_CURSOR(pCur);
  RtreeNode *pNode;
  int eWithin;
  int rc = SQLITE_OK;
  int nCell;
  int nConstraint = pCur->nConstraint;
  int ii;
  int eInt;
  RtreeSearchPoint x;

  eInt = pRtree->eCoordType==RTREE_COORD_INT32;
  while( (p = rtreeSearchPointFirst(pCur))!=0 && p->iLevel>0 ){
    pNode = rtreeNodeOfFirstSearchPoint(pCur, &rc);
    if( rc ) return rc;
    nCell = NCELL(pNode);
    assert( nCell<200 );
    while( p->iCell<nCell ){
      sqlite3_rtree_dbl rScore = (sqlite3_rtree_dbl)-1;
      u8 *pCellData = pNode->zData + (4+pRtree->nBytesPerCell*p->iCell);
      eWithin = FULLY_WITHIN;
      for(ii=0; ii<nConstraint; ii++){
        RtreeConstraint *pConstraint = pCur->aConstraint + ii;
        if( pConstraint->op>=RTREE_MATCH ){
          rc = rtreeCallbackConstraint(pConstraint, eInt, pCellData, p,
                                       &rScore, &eWithin);
          if( rc ) return rc;
        }else if( p->iLevel==1 ){
          rtreeLeafConstraint(pConstraint, eInt, pCellData, &eWithin);
        }else{
          rtreeNonleafConstraint(pConstraint, eInt, pCellData, &eWithin);
        }
        if( eWithin==NOT_WITHIN ) break;
      }
      p->iCell++;
      if( eWithin==NOT_WITHIN ) continue;
      x.iLevel = p->iLevel - 1;
      if( x.iLevel ){
        x.id = readInt64(pCellData);
        x.iCell = 0;
      }else{
        x.id = p->id;
        x.iCell = p->iCell - 1;
      }
      if( p->iCell>=nCell ){
        RTREE_QUEUE_TRACE(pCur, "POP-S:");
        rtreeSearchPointPop(pCur);
      }
      if( rScore<RTREE_ZERO ) rScore = RTREE_ZERO;
      p = rtreeSearchPointNew(pCur, rScore, x.iLevel);
      if( p==0 ) return SQLITE_NOMEM;
      p->eWithin = (u8)eWithin;
      p->id = x.id;
      p->iCell = x.iCell;
      RTREE_QUEUE_TRACE(pCur, "PUSH-S:");
      break;
    }
    if( p->iCell>=nCell ){
      RTREE_QUEUE_TRACE(pCur, "POP-Se:");
      rtreeSearchPointPop(pCur);
    }
  }
  pCur->atEOF = p==0;
  return SQLITE_OK;
}